

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_qp.c
# Opt level: O1

int main(int argc,char **argv)

{
  char acStack_1a8 [8];
  char file4_tmp [24];
  char acStack_188 [8];
  char file3_tmp [23];
  char acStack_168 [8];
  char file2_tmp [22];
  char acStack_148 [8];
  char file1_tmp [21];
  char acStack_128 [8];
  char file4 [20];
  char acStack_108 [8];
  char file1_encoded [19];
  char acStack_e8 [8];
  char file4_decoded [18];
  char acStack_c8 [8];
  char file1 [17];
  char acStack_a8 [8];
  char file2_encoded [20];
  char acStack_88 [8];
  char file3 [19];
  char acStack_68 [8];
  char file2 [18];
  char acStack_48 [8];
  char file3_decoded [17];
  
  builtin_strncpy(acStack_c8,"qp_iso_p",8);
  builtin_strncpy(file1,"lain.txt",9);
  builtin_strncpy(acStack_108,"qp_iso_e",8);
  builtin_strncpy(file1_encoded,"ncoded.txt",0xb);
  builtin_strncpy(acStack_148,"qp_iso_p",8);
  builtin_strncpy(file1_tmp,"lain_tmp.txt",0xd);
  builtin_strncpy(acStack_68,"qp_utf8_",8);
  builtin_strncpy(file2,"plain.txt",10);
  builtin_strncpy(file2_encoded + 8,"txt",4);
  builtin_strncpy(acStack_a8,"qp_utf8_",8);
  builtin_strncpy(file2_encoded,"encoded.",8);
  builtin_strncpy(file2_tmp + 8,"p.txt",6);
  builtin_strncpy(acStack_168,"qp_utf8_",8);
  builtin_strncpy(file2_tmp,"plain_tm",8);
  builtin_strncpy(acStack_88,"qp_iso_e",8);
  builtin_strncpy(file3,"ncoded.txt",0xb);
  builtin_strncpy(file3_decoded,"lain.txt",9);
  builtin_strncpy(acStack_48,"qp_iso_p",8);
  builtin_strncpy(file3_tmp,"ncoded_tmp.txt",0xf);
  builtin_strncpy(acStack_188,"qp_iso_e",8);
  builtin_strncpy(file4 + 8,"txt",4);
  builtin_strncpy(acStack_128,"qp_utf8_",8);
  builtin_strncpy(file4,"encoded.",8);
  builtin_strncpy(file4_decoded,"plain.txt",10);
  builtin_strncpy(acStack_e8,"qp_utf8_",8);
  builtin_strncpy(file4_tmp + 8,"tmp.txt",8);
  builtin_strncpy(acStack_1a8,"qp_utf8_",8);
  builtin_strncpy(file4_tmp,"encoded_",8);
  validate_qp(acStack_c8,acStack_148,acStack_108,1,1);
  validate_qp(acStack_68,acStack_168,acStack_a8,1,1);
  validate_qp(acStack_88,acStack_188,acStack_48,0,1);
  validate_qp(acStack_128,acStack_1a8,acStack_e8,0,1);
  return 0;
}

Assistant:

int main (int argc, char const *argv[]) {
    /* validate encoding with iso input */
    char file1[] = "qp_iso_plain.txt";
    char file1_encoded[] = "qp_iso_encoded.txt";
    char file1_tmp[] = "qp_iso_plain_tmp.txt";

    /* validate encoding with utf-8 input */
    char file2[] = "qp_utf8_plain.txt";
    char file2_encoded[] ="qp_utf8_encoded.txt";
    char file2_tmp[] = "qp_utf8_plain_tmp.txt";

    /* validate decoding with iso input */
    char file3[] = "qp_iso_encoded.txt";
    char file3_decoded[] = "qp_iso_plain.txt";
    char file3_tmp[] = "qp_iso_encoded_tmp.txt";

    /* validate decoding with utf-8 input */
    char file4[] = "qp_utf8_encoded.txt";
    char file4_decoded[] = "qp_utf8_plain.txt";
    char file4_tmp[] = "qp_utf8_encoded_tmp.txt";

    /* really do something */
    validate_qp(file1,file1_tmp,file1_encoded, 1, 1);
    validate_qp(file2,file2_tmp,file2_encoded, 1, 1);
    validate_qp(file3,file3_tmp,file3_decoded, 0, 1);
    validate_qp(file4,file4_tmp,file4_decoded, 0, 1);

    return(0);
}